

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O2

void __thiscall read_color_index::operator()(read_color_index *this,color_index **_ci,xr_reader *r)

{
  uint32_t *puVar1;
  color_index *pcVar2;
  
  pcVar2 = (color_index *)operator_new(0x20);
  (pcVar2->references).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar2->references).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar2->references).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_ci = pcVar2;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  pcVar2->color = *puVar1;
  (r->field_2).m_p = (uint8_t *)((long)puVar1 + 5);
  xray_re::xr_reader::
  r_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_reader::f_r_sz>
            (r,(char)puVar1[1],&pcVar2->references);
  return;
}

Assistant:

void operator()(color_index*& _ci, xr_reader& r) {
	color_index* ci = new color_index;
	_ci = ci;
	ci->color = r.r_u32();
	r.r_seq(r.r_u8(), ci->references, xr_reader::f_r_sz());
}